

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O0

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin_OpenGL
          (shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IGraphicsPlugin> sVar1;
  shared_ptr<(anonymous_namespace)::OpenGLGraphicsPlugin> local_30;
  shared_ptr<IPlatformPlugin> *platformPlugin_local;
  shared_ptr<Options> *options_local;
  
  platformPlugin_local = platformPlugin;
  options_local = options;
  std::
  make_shared<(anonymous_namespace)::OpenGLGraphicsPlugin,std::shared_ptr<Options>const&,std::shared_ptr<IPlatformPlugin>&>
            ((shared_ptr<Options> *)&local_30,platformPlugin);
  std::shared_ptr<IGraphicsPlugin>::shared_ptr<(anonymous_namespace)::OpenGLGraphicsPlugin,void>
            ((shared_ptr<IGraphicsPlugin> *)options,&local_30);
  std::shared_ptr<(anonymous_namespace)::OpenGLGraphicsPlugin>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IGraphicsPlugin>)
         sVar1.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin_OpenGL(const std::shared_ptr<Options>& options,
                                                             std::shared_ptr<IPlatformPlugin> platformPlugin) {
    return std::make_shared<OpenGLGraphicsPlugin>(options, platformPlugin);
}